

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::LoopTerminatorCollector::visitContinueStatement
          (LoopTerminatorCollector *this,ContinueStatement *stmt)

{
  Statement *in_RSI;
  LoopTerminatorCollector *in_RDI;
  
  if ((in_RDI->_firstLevel & 1U) == 0) {
    if ((in_RDI->hasUnconditionalTerm & 1U) == 0) {
      in_RDI->hasCondContinue = true;
    }
  }
  else {
    in_RDI->hasUnconditionalTerm = true;
    in_RDI->hasUnconditionalContinue = true;
    setTerminator(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visitContinueStatement(ContinueStatement *stmt) {
    if (_firstLevel) {
      hasUnconditionalTerm = true;
      hasUnconditionalContinue = true;
      setTerminator(stmt);
    }
    else if (!hasUnconditionalTerm)
      hasCondContinue = true;
  }